

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int VP8LDecodeAlphaImageStream(ALPHDecoder *alph_dec,int last_row)

{
  VP8LBitReader *br;
  VP8LMetadata *hdr;
  uint uVar1;
  VP8LDecoder *dec;
  uint32_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  uint *__src;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  HTreeGroup *local_68;
  
  dec = alph_dec->vp8l_dec;
  iVar10 = 1;
  if (dec->last_row < last_row) {
    if ((alph_dec->use_8b_decode == 0) && (WebPInitAlphaProcessing(), alph_dec->use_8b_decode == 0))
    {
      iVar10 = DecodeImageData(dec,dec->pixels,dec->width,dec->height,last_row,ExtractAlphaRows);
      return iVar10;
    }
    puVar2 = dec->pixels;
    iVar10 = dec->width;
    iVar17 = dec->last_pixel;
    uVar11 = (long)iVar17 / (long)iVar10;
    uVar16 = (long)iVar17 % (long)iVar10;
    uVar19 = uVar11 & 0xffffffff;
    uVar18 = uVar16 & 0xffffffff;
    hdr = &dec->hdr;
    iVar4 = dec->height * iVar10;
    iVar5 = iVar10 * last_row;
    uVar1 = (dec->hdr).huffman_mask;
    if (iVar17 < iVar5) {
      local_68 = GetHtreeGroupForPos(hdr,(int)uVar16,(int)uVar11);
    }
    else {
      local_68 = (HTreeGroup *)0x0;
    }
    br = &dec->br;
    iVar9 = (dec->br).eos;
    while( true ) {
      uVar14 = (uint)uVar19;
      if (iVar17 >= iVar5 || iVar9 != 0) break;
      uVar13 = (uint)uVar18;
      if ((uVar1 & uVar13) == 0) {
        local_68 = GetHtreeGroupForPos(hdr,uVar13,uVar14);
      }
      VP8LFillBitWindow(br);
      uVar6 = ReadSymbol(local_68->htrees[0],br);
      if (uVar6 < 0x100) {
        *(char *)((long)puVar2 + (long)iVar17) = (char)uVar6;
        iVar17 = iVar17 + 1;
        uVar18 = (ulong)(uVar13 + 1);
        if (iVar10 <= (int)(uVar13 + 1)) {
          uVar13 = uVar14 + 1;
          bVar20 = (int)uVar14 < last_row;
          uVar18 = 0;
          uVar14 = uVar13;
          if ((uVar13 & 0xf) == 0 && bVar20) {
            ExtractPalettedAlphaRows(dec,uVar13);
          }
        }
      }
      else {
        if (0x117 < uVar6) goto LAB_001093f5;
        uVar6 = GetCopyDistance(uVar6 - 0x100,br);
        iVar7 = ReadSymbol(local_68->htrees[4],br);
        VP8LFillBitWindow(br);
        iVar7 = GetCopyDistance(iVar7,br);
        iVar7 = PlaneCodeToDistance(iVar10,iVar7);
        if ((iVar17 < iVar7) || (iVar4 - iVar17 < (int)uVar6)) goto LAB_001093f5;
        pbVar15 = (byte *)((long)iVar17 + (long)puVar2);
        __src = (uint *)(pbVar15 + -(long)iVar7);
        if ((int)uVar6 < 8) {
LAB_001092ba:
          if (iVar7 < (int)uVar6) {
            uVar11 = 0;
            if (0 < (int)uVar6) {
              uVar11 = (ulong)uVar6;
            }
            while (bVar20 = uVar11 != 0, uVar11 = uVar11 - 1, bVar20) {
              *pbVar15 = pbVar15[-(long)iVar7];
              pbVar15 = pbVar15 + 1;
            }
          }
          else {
            memcpy(pbVar15,__src,(long)(int)uVar6);
          }
        }
        else {
          uVar14 = uVar6;
          if (iVar7 == 4) {
            uVar8 = *__src;
          }
          else if (iVar7 == 2) {
            uVar8 = (uint)(ushort)*__src * 0x10001;
          }
          else {
            if (iVar7 != 1) goto LAB_001092ba;
            uVar8 = (uint)(byte)*__src * 0x1010101;
          }
          for (; ((ulong)pbVar15 & 3) != 0; pbVar15 = pbVar15 + 1) {
            uVar3 = *__src;
            __src = (uint *)((long)__src + 1);
            *pbVar15 = (byte)uVar3;
            uVar8 = uVar8 << 0x18 | uVar8 >> 8;
            uVar14 = uVar14 - 1;
          }
          uVar11 = (ulong)(uint)((int)uVar14 >> 2);
          if ((int)uVar14 >> 2 < 1) {
            uVar11 = 0;
          }
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            *(uint *)(pbVar15 + uVar16 * 4) = uVar8;
          }
          pbVar15 = pbVar15 + uVar11 * 4;
          for (lVar12 = uVar11 << 2; lVar12 < (int)uVar14; lVar12 = lVar12 + 1) {
            *pbVar15 = *(byte *)((long)__src + lVar12);
            pbVar15 = pbVar15 + 1;
          }
        }
        uVar13 = uVar13 + uVar6;
        while( true ) {
          uVar18 = (ulong)uVar13;
          uVar14 = (uint)uVar19;
          if ((int)uVar13 < iVar10) break;
          uVar8 = uVar14 + 1;
          if ((uVar8 & 0xf) == 0 && (int)uVar14 < last_row) {
            ExtractPalettedAlphaRows(dec,uVar8);
          }
          uVar19 = (ulong)uVar8;
          uVar13 = uVar13 - iVar10;
        }
        iVar17 = iVar17 + uVar6;
        if ((iVar17 < iVar5) && ((uVar13 & uVar1) != 0)) {
          local_68 = GetHtreeGroupForPos(hdr,uVar13,uVar14);
        }
      }
      iVar9 = VP8LIsEndOfStream(br);
      (dec->br).eos = iVar9;
      uVar19 = (ulong)uVar14;
    }
    if ((int)uVar14 < last_row) {
      last_row = uVar14;
    }
    ExtractPalettedAlphaRows(dec,last_row);
LAB_001093f5:
    iVar7 = VP8LIsEndOfStream(br);
    (dec->br).eos = iVar7;
    if ((iVar17 < iVar5 && iVar9 == 0) || ((iVar7 != 0 && (iVar17 < iVar4)))) {
      if ((dec->status == VP8_STATUS_SUSPENDED) || (iVar10 = 0, dec->status == VP8_STATUS_OK)) {
        dec->status = (uint)(iVar7 != 0) * 2 + VP8_STATUS_BITSTREAM_ERROR;
        iVar10 = 0;
      }
    }
    else {
      dec->last_pixel = iVar17;
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

int VP8LDecodeAlphaImageStream(ALPHDecoder* const alph_dec, int last_row) {
  VP8LDecoder* const dec = alph_dec->vp8l_dec;
  assert(dec != NULL);
  assert(last_row <= dec->height);

  if (dec->last_row >= last_row) {
    return 1;  // done
  }

  if (!alph_dec->use_8b_decode) WebPInitAlphaProcessing();

  // Decode (with special row processing).
  return alph_dec->use_8b_decode ?
      DecodeAlphaData(dec, (uint8_t*)dec->pixels, dec->width, dec->height,
                      last_row) :
      DecodeImageData(dec, dec->pixels, dec->width, dec->height,
                      last_row, ExtractAlphaRows);
}